

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandPrintExdc(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Abc_Ntk_t *pAVar5;
  char *pcVar6;
  char *format;
  double local_30;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  bVar1 = false;
  Extra_UtilGetoptReset();
  while( true ) {
    do {
      iVar2 = Extra_UtilGetopt(argc,argv,"sdh");
    } while (iVar2 == 0x73);
    if (iVar2 == -1) break;
    if (iVar2 != 100) {
      iVar2 = -2;
      Abc_Print(-2,"usage: print_exdc [-dh]\n");
      Abc_Print(-2,"\t        prints the EXDC network statistics\n");
      pcVar6 = "yes";
      if (!bVar1) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-d    : toggles printing don\'t-care percentage [default = %s]\n",pcVar6);
      pcVar6 = "\t-h    : print the command usage\n";
LAB_001e7493:
      Abc_Print(iVar2,pcVar6);
      return 1;
    }
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (pAVar3 == (Abc_Ntk_t *)0x0) {
    pcVar6 = "Empty network.\n";
  }
  else {
    pAVar5 = pAVar3->pExdc;
    if (pAVar5 != (Abc_Ntk_t *)0x0) {
      if (bVar1) {
        if (pAVar5->ntkType == ABC_NTK_STRASH) {
          pAVar4 = Abc_NtkPo(pAVar5,0);
          pAVar4 = Abc_ObjChild0(pAVar4);
          local_30 = Abc_NtkSpacePercentage(pAVar4);
        }
        else {
          pAVar5 = Abc_NtkStrash(pAVar5,0,0,0);
          pAVar4 = Abc_NtkPo(pAVar5,0);
          pAVar4 = Abc_ObjChild0(pAVar4);
          local_30 = Abc_NtkSpacePercentage(pAVar4);
          Abc_NtkDelete(pAVar5);
        }
        Abc_Print(1,"EXDC network statistics: ");
        Abc_Print(1,"(");
        pcVar6 = "%.6f";
        if (99.999995 <= local_30) {
          pcVar6 = "%f";
        }
        if (local_30 <= 5e-06) {
          pcVar6 = "%f";
        }
        format = "%.2f";
        if (99.95 <= local_30) {
          format = pcVar6;
        }
        if (local_30 <= 0.05) {
          format = pcVar6;
        }
        Abc_Print(1,format);
        pcVar6 = " %% don\'t-cares)\n";
      }
      else {
        pcVar6 = "EXDC network statistics: \n";
      }
      Abc_Print(1,pcVar6);
      Abc_NtkPrintStats(pAVar3->pExdc,0,0,0,0,0,0,0,0,0);
      return 0;
    }
    pcVar6 = "Network has no EXDC.\n";
  }
  iVar2 = -1;
  goto LAB_001e7493;
}

Assistant:

int Abc_CommandPrintExdc( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkTemp;
    double Percentage;
    int fShort;
    int c;
    int fPrintDc;
    extern double Abc_NtkSpacePercentage( Abc_Obj_t * pNode );
    pNtk = Abc_FrameReadNtk(pAbc);

    // set the defaults
    fShort  = 1;
    fPrintDc = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "sdh" ) ) != EOF )
    {
        switch ( c )
        {
        case 's':
            fShort ^= 1;
            break;
        case 'd':
            fPrintDc ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( pNtk->pExdc == NULL )
    {
        Abc_Print( -1, "Network has no EXDC.\n" );
        return 1;
    }

    if ( fPrintDc )
    {
        if ( !Abc_NtkIsStrash(pNtk->pExdc) )
        {
            pNtkTemp = Abc_NtkStrash(pNtk->pExdc, 0, 0, 0);
            Percentage = Abc_NtkSpacePercentage( Abc_ObjChild0( Abc_NtkPo(pNtkTemp, 0) ) );
            Abc_NtkDelete( pNtkTemp );
        }
        else
            Percentage = Abc_NtkSpacePercentage( Abc_ObjChild0( Abc_NtkPo(pNtk->pExdc, 0) ) );

        Abc_Print( 1, "EXDC network statistics: " );
        Abc_Print( 1, "(" );
        if ( Percentage > 0.05 && Percentage < 99.95 )
            Abc_Print( 1, "%.2f", Percentage );
        else if ( Percentage > 0.000005 && Percentage < 99.999995 )
            Abc_Print( 1, "%.6f", Percentage );
        else
            Abc_Print( 1, "%f", Percentage );
        Abc_Print( 1, " %% don't-cares)\n" );
    }
    else
        Abc_Print( 1, "EXDC network statistics: \n" );
    Abc_NtkPrintStats( pNtk->pExdc, 0, 0, 0, 0, 0, 0, 0, 0, 0 );
    return 0;

usage:
    Abc_Print( -2, "usage: print_exdc [-dh]\n" );
    Abc_Print( -2, "\t        prints the EXDC network statistics\n" );
    Abc_Print( -2, "\t-d    : toggles printing don't-care percentage [default = %s]\n", fPrintDc? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}